

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O3

QSet<QtGraphicsAnchorLayout::AnchorData_*>
operator+(QSet<QtGraphicsAnchorLayout::AnchorData_*> *lhs,
         QSet<QtGraphicsAnchorLayout::AnchorData_*> *rhs)

{
  ulong uVar1;
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> QVar2;
  long *in_RDX;
  ulong uVar3;
  Data *pDVar4;
  long in_FS_OFFSET;
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> local_50;
  QHashDummyValue local_41;
  anon_struct_8_1_898a9ca8_for_storage local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d = (rhs->q_hash).d;
  if (local_50.d == (Data *)0x0) {
    QVar2.d = (Data *)0x0;
  }
  else {
    QVar2.d = local_50.d;
    if (((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      ((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  pDVar4 = (Data *)*in_RDX;
  if (QVar2.d == pDVar4) goto LAB_005c3b3d;
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
    uVar3 = 0;
LAB_005c3aa2:
    if (pDVar4 == (Data *)0x0 && uVar3 == 0) goto LAB_005c3b3d;
  }
  else {
    if (pDVar4->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (pDVar4->numBuckets == uVar3) {
          pDVar4 = (Data *)0x0;
          uVar3 = 0;
          break;
        }
        uVar1 = uVar3 + 1;
      } while (pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
      goto LAB_005c3aa2;
    }
    uVar3 = 0;
  }
  do {
    local_40.data =
         *&pDVar4->spans[uVar3 >> 7].entries[pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].
           storage.data;
    QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue> *)&local_50,
               (AnchorData **)&local_40,&local_41);
    do {
      if (pDVar4->numBuckets - 1 == uVar3) {
        uVar3 = 0;
        pDVar4 = (Data *)0x0;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    QVar2.d = local_50.d;
  } while (uVar3 != 0 || pDVar4 != (Data *)0x0);
LAB_005c3b3d:
  (lhs->q_hash).d = QVar2.d;
  if ((QVar2.d != (Data *)0x0) &&
     (((QVar2.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((QVar2.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((QVar2.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QSet<QtGraphicsAnchorLayout::AnchorData_*>)(Hash)lhs;
}

Assistant:

friend QSet operator+(const QSet &lhs, const QSet &rhs) { return QSet(lhs) += rhs; }